

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_out_prod(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b)

{
  _Bool _Var1;
  ggml_tensor *pgVar2;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *result;
  int64_t ne [4];
  int in_stack_ffffffffffffffb8;
  ggml_type in_stack_ffffffffffffffbc;
  ggml_context *in_stack_ffffffffffffffc0;
  
  _Var1 = ggml_can_out_prod(in_RSI,in_RDX);
  if (!_Var1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,0xb04,"GGML_ASSERT(%s) failed","ggml_can_out_prod(a, b)");
  }
  _Var1 = ggml_is_transposed(in_RSI);
  if (!_Var1) {
    pgVar2 = ggml_new_tensor(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                             in_stack_ffffffffffffffb8,(int64_t *)0x14d176);
    pgVar2->op = GGML_OP_OUT_PROD;
    pgVar2->src[0] = in_RSI;
    pgVar2->src[1] = in_RDX;
    return pgVar2;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c",
             0xb05,"GGML_ASSERT(%s) failed","!ggml_is_transposed(a)");
}

Assistant:

struct ggml_tensor * ggml_out_prod(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b) {
    GGML_ASSERT(ggml_can_out_prod(a, b));
    GGML_ASSERT(!ggml_is_transposed(a));

    // a is broadcastable to b for ne[2] and ne[3] -> use b->ne[2] and b->ne[3]
    const int64_t ne[4] = { a->ne[0], b->ne[0], b->ne[2], b->ne[3] };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne);

    result->op     = GGML_OP_OUT_PROD;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}